

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generics.c++
# Opt level: O0

void __thiscall
capnp::compiler::BrandScope::BrandScope
          (BrandScope *this,ErrorReporter *errorReporter,uint64_t startingScopeId,
          uint startingScopeParamCount,Resolver *startingScope)

{
  NullableValue<capnp::compiler::Resolver::ResolvedDecl> *other;
  ResolvedDecl *pRVar1;
  undefined1 local_140 [40];
  ResolvedDecl *p;
  undefined1 local_b0 [8];
  NullableValue<capnp::compiler::Resolver::ResolvedDecl> _p253;
  Resolver *startingScope_local;
  uint startingScopeParamCount_local;
  uint64_t startingScopeId_local;
  ErrorReporter *errorReporter_local;
  BrandScope *this_local;
  
  kj::Refcounted::Refcounted(&this->super_Refcounted);
  (this->super_Refcounted).super_Disposer._vptr_Disposer = (_func_int **)&PTR_disposeImpl_00d94090;
  this->errorReporter = errorReporter;
  kj::Maybe<kj::Own<capnp::compiler::BrandScope,_std::nullptr_t>_>::Maybe();
  this->leafId = startingScopeId;
  this->leafParamCount = startingScopeParamCount;
  this->inherited = true;
  kj::Array<capnp::compiler::BrandedDecl>::Array(&this->params);
  (*startingScope->_vptr_Resolver[4])(&p);
  other = kj::_::readMaybe<capnp::compiler::Resolver::ResolvedDecl>
                    ((Maybe<capnp::compiler::Resolver::ResolvedDecl> *)&p);
  kj::_::NullableValue<capnp::compiler::Resolver::ResolvedDecl>::NullableValue
            ((NullableValue<capnp::compiler::Resolver::ResolvedDecl> *)local_b0,other);
  kj::Maybe<capnp::compiler::Resolver::ResolvedDecl>::~Maybe
            ((Maybe<capnp::compiler::Resolver::ResolvedDecl> *)&p);
  pRVar1 = kj::_::NullableValue::operator_cast_to_ResolvedDecl_((NullableValue *)local_b0);
  if (pRVar1 != (ResolvedDecl *)0x0) {
    local_140._32_8_ =
         kj::_::NullableValue<capnp::compiler::Resolver::ResolvedDecl>::operator*
                   ((NullableValue<capnp::compiler::Resolver::ResolvedDecl> *)local_b0);
    kj::
    refcounted<capnp::compiler::BrandScope,capnp::compiler::ErrorReporter&,unsigned_long&,unsigned_int&,capnp::compiler::Resolver&>
              ((kj *)local_140,errorReporter,(unsigned_long *)local_140._32_8_,
               &((ResolvedDecl *)local_140._32_8_)->genericParamCount,
               ((ResolvedDecl *)local_140._32_8_)->resolver);
    kj::Maybe<kj::Own<capnp::compiler::BrandScope,_std::nullptr_t>_>::Maybe
              ((Maybe<kj::Own<capnp::compiler::BrandScope,_std::nullptr_t>_> *)(local_140 + 0x10),
               (Own<capnp::compiler::BrandScope,_std::nullptr_t> *)local_140);
    kj::Maybe<kj::Own<capnp::compiler::BrandScope,_std::nullptr_t>_>::operator=
              (&this->parent,
               (Maybe<kj::Own<capnp::compiler::BrandScope,_std::nullptr_t>_> *)(local_140 + 0x10));
    kj::Maybe<kj::Own<capnp::compiler::BrandScope,_std::nullptr_t>_>::~Maybe
              ((Maybe<kj::Own<capnp::compiler::BrandScope,_std::nullptr_t>_> *)(local_140 + 0x10));
    kj::Own<capnp::compiler::BrandScope,_std::nullptr_t>::~Own
              ((Own<capnp::compiler::BrandScope,_std::nullptr_t> *)local_140);
  }
  kj::_::NullableValue<capnp::compiler::Resolver::ResolvedDecl>::~NullableValue
            ((NullableValue<capnp::compiler::Resolver::ResolvedDecl> *)local_b0);
  return;
}

Assistant:

BrandScope::BrandScope(ErrorReporter& errorReporter, uint64_t startingScopeId,
                       uint startingScopeParamCount, Resolver& startingScope)
    : errorReporter(errorReporter), parent(kj::none), leafId(startingScopeId),
      leafParamCount(startingScopeParamCount), inherited(true) {
  // Create all lexical parent scopes, all with no brand bindings.
  KJ_IF_SOME(p, startingScope.getParent()) {
    parent = kj::refcounted<BrandScope>(
        errorReporter, p.id, p.genericParamCount, *p.resolver);
  }
}